

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

void __thiscall
QMetaObjectBuilderPrivate::~QMetaObjectBuilderPrivate(QMetaObjectBuilderPrivate *this)

{
  QArrayDataPointer<const_QMetaObject_*>::~QArrayDataPointer(&(this->relatedMetaObjects).d);
  std::vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>::~vector
            (&this->enumerators);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&(this->classInfoValues).d);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&(this->classInfoNames).d);
  std::vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>::~vector
            (&this->properties);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::~vector
            (&this->constructors);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::~vector
            (&this->methods);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this);
  return;
}

Assistant:

QMetaObjectBuilderPrivate()
        : flags(0)
    {
        superClass = &QObject::staticMetaObject;
        staticMetacallFunction = nullptr;
    }